

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

int Gia_ManLutSizeMax(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  iVar5 = -1;
  if (1 < (long)p->nObjs) {
    uVar1 = p->vMapping->nSize;
    uVar6 = 1;
    if (1 < (int)uVar1) {
      uVar6 = (ulong)uVar1;
    }
    uVar7 = 1;
    do {
      if (uVar6 == uVar7) {
LAB_0020c29e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar4 = p->vMapping->pArray;
      uVar2 = piVar4[uVar7];
      if ((ulong)uVar2 != 0) {
        if (((int)uVar2 < 0) || ((int)uVar1 <= (int)uVar2)) goto LAB_0020c29e;
        iVar3 = piVar4[uVar2];
        if (iVar5 <= iVar3) {
          iVar5 = iVar3;
        }
      }
      uVar7 = uVar7 + 1;
    } while ((long)p->nObjs != uVar7);
  }
  return iVar5;
}

Assistant:

int Gia_ManLutSizeMax( Gia_Man_t * p )
{
    int i, nSizeMax = -1;
    Gia_ManForEachLut( p, i )
        nSizeMax = Abc_MaxInt( nSizeMax, Gia_ObjLutSize(p, i) );
    return nSizeMax;
}